

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::quantize
          (cbtAxisSweep3Internal<unsigned_short> *this,unsigned_short *out,cbtVector3 *point,
          int isMax)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  float fVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  float fVar8;
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar9;
  cbtVector3 local_28;
  
  uVar3 = (ushort)isMax;
  auVar7 = in_ZMM0._8_56_;
  cVar9 = ::operator-(point,&this->m_worldAabbMin);
  auVar5._0_8_ = cVar9.m_floats._0_8_;
  auVar5._8_56_ = auVar7;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar9.m_floats._8_8_;
  local_28.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar5._0_16_,auVar1);
  auVar7 = ZEXT856(local_28.m_floats._8_8_);
  cVar9 = ::operator*(&local_28,&this->m_quantize);
  fVar8 = cVar9.m_floats[2];
  auVar6._0_8_ = cVar9.m_floats._0_8_;
  auVar6._8_56_ = auVar7;
  fVar4 = cVar9.m_floats[0];
  uVar2 = uVar3;
  if (0.0 < fVar4) {
    uVar2 = this->m_handleSentinel;
    if (fVar4 < (float)uVar2) {
      uVar2 = (ushort)(int)fVar4;
    }
    uVar2 = uVar2 & this->m_bpHandleMask | uVar3;
  }
  auVar1 = vmovshdup_avx(auVar6._0_16_);
  *out = uVar2;
  fVar4 = auVar1._0_4_;
  uVar2 = uVar3;
  if (0.0 < fVar4) {
    uVar2 = this->m_handleSentinel;
    if (fVar4 < (float)uVar2) {
      uVar2 = (ushort)(int)fVar4;
    }
    uVar2 = uVar2 & this->m_bpHandleMask | uVar3;
  }
  out[1] = uVar2;
  if (0.0 < fVar8) {
    uVar2 = this->m_handleSentinel;
    if (fVar8 < (float)uVar2) {
      uVar2 = (ushort)(int)fVar8;
    }
    uVar3 = uVar2 & this->m_bpHandleMask | uVar3;
  }
  out[2] = uVar3;
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::quantize(BP_FP_INT_TYPE* out, const cbtVector3& point, int isMax) const
{
#ifdef OLD_CLAMPING_METHOD
	///problem with this clamping method is that the floating point during quantization might still go outside the range [(0|isMax) .. (m_handleSentinel&m_bpHandleMask]|isMax]
	///see http://code.google.com/p/bullet/issues/detail?id=87
	cbtVector3 clampedPoint(point);
	clampedPoint.setMax(m_worldAabbMin);
	clampedPoint.setMin(m_worldAabbMax);
	cbtVector3 v = (clampedPoint - m_worldAabbMin) * m_quantize;
	out[0] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getX() & m_bpHandleMask) | isMax);
	out[1] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getY() & m_bpHandleMask) | isMax);
	out[2] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getZ() & m_bpHandleMask) | isMax);
#else
	cbtVector3 v = (point - m_worldAabbMin) * m_quantize;
	out[0] = (v[0] <= 0) ? (BP_FP_INT_TYPE)isMax : (v[0] >= m_handleSentinel) ? (BP_FP_INT_TYPE)((m_handleSentinel & m_bpHandleMask) | isMax) : (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[0] & m_bpHandleMask) | isMax);
	out[1] = (v[1] <= 0) ? (BP_FP_INT_TYPE)isMax : (v[1] >= m_handleSentinel) ? (BP_FP_INT_TYPE)((m_handleSentinel & m_bpHandleMask) | isMax) : (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[1] & m_bpHandleMask) | isMax);
	out[2] = (v[2] <= 0) ? (BP_FP_INT_TYPE)isMax : (v[2] >= m_handleSentinel) ? (BP_FP_INT_TYPE)((m_handleSentinel & m_bpHandleMask) | isMax) : (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[2] & m_bpHandleMask) | isMax);
#endif  //OLD_CLAMPING_METHOD
}